

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> wabt::MakeUnique<wabt::Module>(void)

{
  Module *this;
  __uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true> in_RDI;
  
  this = (Module *)operator_new(0x370);
  memset(this,0,0x370);
  Module::Module(this);
  std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
  unique_ptr<std::default_delete<wabt::Module>,void>
            ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)
             in_RDI.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
             super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
         (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
         in_RDI.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
         super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}